

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::coap::
CoapTest_CoapMessageOptions_MultipleOptionsSerializationAndDeserialization_Test::TestBody
          (CoapTest_CoapMessageOptions_MultipleOptionsSerializationAndDeserialization_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined1 *puVar4;
  _Base_ptr p_Var5;
  undefined8 uVar6;
  pointer *__ptr;
  char *pcVar7;
  bool bVar8;
  initializer_list<unsigned_char> __l;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_3;
  string uriPath;
  ByteArray expectedBuffer;
  shared_ptr<ot::commissioner::coap::Message> message;
  ContentFormat accept;
  ContentFormat contentFormat;
  ByteArray buffer;
  Error error;
  AssertHelper local_f8;
  undefined8 *local_f0;
  undefined1 local_e8 [48];
  undefined1 local_b8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  undefined1 local_80 [16];
  ContentFormat local_70;
  ContentFormat local_6c;
  ByteArray local_68;
  Error local_48;
  
  local_e8._0_8_ = local_e8._0_8_ & 0xffffffffffffff00;
  local_b8[0] = 1;
  local_80._0_8_ = (Message *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ot::commissioner::coap::Message,std::allocator<ot::commissioner::coap::Message>,ot::commissioner::coap::Type,ot::commissioner::coap::Code>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8),(Message **)local_80,
             (allocator<ot::commissioner::coap::Message> *)&local_48,local_e8,local_e8 + 0x30);
  uVar6 = local_80._0_8_;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.mCode = kNone;
  paVar1 = &local_48.mMessage.field_2;
  local_48.mMessage._M_string_length = 0;
  local_48.mMessage.field_2._M_local_buf[0] = '\0';
  p_Var5 = (_Base_ptr)(local_e8 + 0x40);
  local_b8._0_8_ = p_Var5;
  local_48.mMessage._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_e8 + 0x30),".well-known/est/rv/","");
  Message::SetUriPath((Error *)local_e8,(Message *)uVar6,(string *)(local_e8 + 0x30));
  local_f8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_98,"message->SetUriPath(\".well-known/est/rv/\")","ErrorCode::kNone"
             ,(Error *)local_e8,(ErrorCode *)&local_f8);
  puVar4 = local_e8 + 0x18;
  if ((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) != puVar4) {
    operator_delete((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_));
  }
  if ((_Base_ptr)local_b8._0_8_ != p_Var5) {
    operator_delete((void *)local_b8._0_8_);
  }
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = *(char **)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_e8 + 0x30),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xe1,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_e8 + 0x30),(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_e8 + 0x30));
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._0_8_ + 8))();
    }
  }
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  }
  Message::SetContentFormat((Error *)local_e8,(Message *)local_80._0_8_,kCBOR);
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)(local_e8 + 0x30),"message->SetContentFormat(ContentFormat::kCBOR)",
             "ErrorCode::kNone",(Error *)local_e8,(ErrorCode *)&local_98);
  if ((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) != puVar4) {
    operator_delete((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_));
  }
  if (local_b8[0] == '\0') {
    testing::Message::Message((Message *)local_e8);
    if ((undefined8 *)local_b8._8_8_ == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xe2,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._0_8_ + 8))();
    }
  }
  uVar6 = local_b8._8_8_;
  if ((undefined8 *)local_b8._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_b8._8_8_ != (undefined8 *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar6);
  }
  Message::SetAccept((Error *)local_e8,(Message *)local_80._0_8_,kCoseSign1);
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)(local_e8 + 0x30),"message->SetAccept(ContentFormat::kCoseSign1)",
             "ErrorCode::kNone",(Error *)local_e8,(ErrorCode *)&local_98);
  if ((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) != puVar4) {
    operator_delete((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_));
  }
  if (local_b8[0] == '\0') {
    testing::Message::Message((Message *)local_e8);
    if ((undefined8 *)local_b8._8_8_ == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xe3,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._0_8_ + 8))();
    }
  }
  uVar6 = local_b8._8_8_;
  if ((undefined8 *)local_b8._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_b8._8_8_ != (undefined8 *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar6);
  }
  local_b8._0_8_ = *(size_t *)(local_80._0_8_ + 0x38);
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e8,"message->GetOptionNum()","3",(unsigned_long *)(local_e8 + 0x30),
             (int *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)(local_e8 + 0x30));
    if ((undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = *(char **)CONCAT53(local_e8._11_5_,local_e8._8_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xe4,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_98,(Message *)(local_e8 + 0x30));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((_Base_ptr)local_b8._0_8_ != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_b8._0_8_ + 8))();
    }
  }
  puVar2 = (undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_);
  if (puVar2 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar2 != puVar2 + 2) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
  }
  Message::Serialize((Error *)local_e8,(Message *)local_80._0_8_,&local_68);
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)(local_e8 + 0x30),"message->Serialize(buffer)","ErrorCode::kNone",
             (Error *)local_e8,(ErrorCode *)&local_98);
  if ((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) != puVar4) {
    operator_delete((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_));
  }
  if (local_b8[0] == '\0') {
    testing::Message::Message((Message *)local_e8);
    if ((undefined8 *)local_b8._8_8_ == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xe5,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._0_8_ + 8))();
    }
  }
  uVar6 = local_b8._8_8_;
  if ((undefined8 *)local_b8._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_b8._8_8_ != (undefined8 *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_b8._8_8_);
    }
    operator_delete((void *)uVar6);
  }
  local_e8._16_3_ = 0x736503;
  local_e8._19_8_ = 0x12513c1176720274;
  local_e8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x65772ebb00000140;
  local_e8[8] = 'l';
  local_e8[9] = 'l';
  local_e8[10] = '-';
  local_e8._11_5_ = 0x6e776f6e6b;
  __l._M_len = 0x1b;
  __l._M_array = local_e8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_98,__l,(allocator_type *)(local_e8 + 0x30));
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)local_e8,"buffer","expectedBuffer",&local_68,&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)(local_e8 + 0x30));
    if ((undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = *(char **)CONCAT53(local_e8._11_5_,local_e8._8_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xf6,pcVar7);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)(local_e8 + 0x30));
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((_Base_ptr)local_b8._0_8_ != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_b8._0_8_ + 8))();
    }
  }
  puVar2 = (undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_);
  if (puVar2 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar2 != puVar2 + 2) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
  }
  Message::Deserialize((Message *)local_e8,&local_48,&local_68);
  uVar6 = local_80._8_8_;
  local_80._0_8_ = local_e8._0_8_;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT53(local_e8._11_5_,local_e8._8_3_);
  local_e8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_e8[8] = '\0';
  local_e8[9] = '\0';
  local_e8[10] = '\0';
  local_e8._11_5_ = 0;
  bVar8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_80._8_8_ = p_Var3;
  if (bVar8) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT53(local_e8._11_5_,local_e8._8_3_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT53(local_e8._11_5_,local_e8._8_3_));
  }
  local_b8._0_8_ = (_Base_ptr)0x0;
  testing::internal::CmpHelperNE<std::shared_ptr<ot::commissioner::coap::Message>,decltype(nullptr)>
            ((internal *)local_e8,"message","nullptr",
             (shared_ptr<ot::commissioner::coap::Message> *)local_80,(void **)(local_e8 + 0x30));
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)(local_e8 + 0x30));
    if ((undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = *(char **)CONCAT53(local_e8._11_5_,local_e8._8_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xf9,pcVar7);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)(local_e8 + 0x30));
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((_Base_ptr)local_b8._0_8_ != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_b8._0_8_ + 8))();
    }
  }
  puVar2 = (undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_);
  if (puVar2 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar2 != puVar2 + 2) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
  }
  local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)local_e8,"error","ErrorCode::kNone",&local_48,
             (ErrorCode *)(local_e8 + 0x30));
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)(local_e8 + 0x30));
    if ((undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = *(char **)CONCAT53(local_e8._11_5_,local_e8._8_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xfa,pcVar7);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)(local_e8 + 0x30));
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((_Base_ptr)local_b8._0_8_ != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_b8._0_8_ + 8))();
    }
  }
  puVar2 = (undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_);
  if (puVar2 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar2 != puVar2 + 2) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
  }
  local_b8._0_8_ = *(size_t *)(local_80._0_8_ + 0x38);
  local_f8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e8,"message->GetOptionNum()","3",(unsigned_long *)(local_e8 + 0x30),
             (int *)&local_f8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)(local_e8 + 0x30));
    if ((undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = *(char **)CONCAT53(local_e8._11_5_,local_e8._8_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xfc,pcVar7);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)(local_e8 + 0x30));
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((_Base_ptr)local_b8._0_8_ != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_b8._0_8_ + 8))();
    }
  }
  puVar2 = (undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_);
  if (puVar2 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar2 != puVar2 + 2) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
  }
  Message::GetContentFormat((Error *)local_e8,(Message *)local_80._0_8_,&local_6c);
  local_f8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)(local_e8 + 0x30),"message->GetContentFormat(contentFormat)",
             "ErrorCode::kNone",(Error *)local_e8,(ErrorCode *)&local_f8);
  if ((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) != puVar4) {
    operator_delete((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_));
  }
  if (local_b8[0] == '\0') {
    testing::Message::Message((Message *)local_e8);
    if ((undefined8 *)local_b8._8_8_ == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xff,pcVar7);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._0_8_ + 8))();
    }
  }
  if ((undefined8 *)local_b8._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_b8._8_8_ != (undefined8 *)(local_b8._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_b8._8_8_);
    }
    operator_delete((void *)local_b8._8_8_);
  }
  local_b8._0_4_ = 0x3c;
  testing::internal::
  CmpHelperEQ<ot::commissioner::coap::ContentFormat,ot::commissioner::coap::ContentFormat>
            ((internal *)local_e8,"contentFormat","ContentFormat::kCBOR",&local_6c,
             (ContentFormat *)(local_e8 + 0x30));
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)(local_e8 + 0x30));
    if ((undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = *(char **)CONCAT53(local_e8._11_5_,local_e8._8_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x100,pcVar7);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)(local_e8 + 0x30));
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((_Base_ptr)local_b8._0_8_ != (_Base_ptr)0x0) {
      (**(code **)(*(long *)local_b8._0_8_ + 8))();
    }
  }
  puVar2 = (undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_);
  if (puVar2 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar2 != puVar2 + 2) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
  }
  local_b8._8_8_ = 0;
  local_b8[0x10] = 0;
  local_b8._0_8_ = p_Var5;
  Message::GetOption((Error *)local_e8,(Message *)local_80._0_8_,(string *)(local_e8 + 0x30),
                     kUriPath);
  local_e8._40_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_f8,"message->GetUriPath(uriPath)","ErrorCode::kNone",
             (Error *)local_e8,(ErrorCode *)(local_e8 + 0x28));
  if ((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) != puVar4) {
    operator_delete((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_));
  }
  if (local_f8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = (char *)*local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_e8 + 0x28),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x103,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_e8 + 0x28),(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_e8 + 0x28));
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._0_8_ + 8))();
    }
  }
  puVar2 = local_f0;
  if (local_f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_f0 != local_f0 + 2) {
      operator_delete((undefined8 *)*local_f0);
    }
    operator_delete(puVar2);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[20]>
            ((internal *)local_e8,"uriPath","\"/.well-known/est/rv\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_e8 + 0x30),
             (char (*) [20])"/.well-known/est/rv");
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if ((undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = *(char **)CONCAT53(local_e8._11_5_,local_e8._8_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_e8 + 0x28),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x106,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_e8 + 0x28),(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_e8 + 0x28));
    if ((long *)CONCAT44(local_f8.data_._4_4_,local_f8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_f8.data_._4_4_,local_f8.data_._0_4_) + 8))();
    }
  }
  puVar2 = (undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_);
  if (puVar2 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar2 != puVar2 + 2) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
  }
  Message::GetAccept((Error *)local_e8,(Message *)local_80._0_8_,&local_70);
  local_e8._40_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_f8,"message->GetAccept(accept)","ErrorCode::kNone",(Error *)local_e8
             ,(ErrorCode *)(local_e8 + 0x28));
  if ((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) != puVar4) {
    operator_delete((undefined1 *)CONCAT53(local_e8._11_5_,local_e8._8_3_));
  }
  if (local_f8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0 == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = (char *)*local_f0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_e8 + 0x28),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x109,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_e8 + 0x28),(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_e8 + 0x28));
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._0_8_ + 8))();
    }
  }
  if (local_f0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_f0 != local_f0 + 2) {
      operator_delete((undefined8 *)*local_f0);
    }
    operator_delete(local_f0);
  }
  local_f8.data_._0_4_ = 0x12;
  testing::internal::
  CmpHelperEQ<ot::commissioner::coap::ContentFormat,ot::commissioner::coap::ContentFormat>
            ((internal *)local_e8,"accept","ContentFormat::kCoseSign1",&local_70,
             (ContentFormat *)&local_f8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if ((undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_) == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = *(char **)CONCAT53(local_e8._11_5_,local_e8._8_3_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_e8 + 0x28),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x10a,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_e8 + 0x28),(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_e8 + 0x28));
    if ((long *)CONCAT44(local_f8.data_._4_4_,local_f8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_f8.data_._4_4_,local_f8.data_._0_4_) + 8))();
    }
  }
  puVar2 = (undefined8 *)CONCAT53(local_e8._11_5_,local_e8._8_3_);
  if (puVar2 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar2 != puVar2 + 2) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
  }
  if ((_Base_ptr)local_b8._0_8_ != p_Var5) {
    operator_delete((void *)local_b8._0_8_);
  }
  if ((void *)CONCAT44(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_98.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_98.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.mMessage._M_dataplus._M_p);
  }
  if ((Endpoint *)
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (Endpoint *)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  return;
}

Assistant:

TEST(CoapTest, CoapMessageOptions_MultipleOptionsSerializationAndDeserialization)
{
    auto      message = std::make_shared<Message>(Type::kConfirmable, Code::kGet);
    ByteArray buffer;
    Error     error;

    EXPECT_EQ(message->SetUriPath(".well-known/est/rv/"), ErrorCode::kNone);
    EXPECT_EQ(message->SetContentFormat(ContentFormat::kCBOR), ErrorCode::kNone);
    EXPECT_EQ(message->SetAccept(ContentFormat::kCoseSign1), ErrorCode::kNone);
    EXPECT_EQ(message->GetOptionNum(), 3);
    EXPECT_EQ(message->Serialize(buffer), ErrorCode::kNone);

    auto expectedBuffer = ByteArray{0x40, 0x01,
                                    0x00, 0x00, // header
                                    0xbb, '.',
                                    'w',  'e',
                                    'l',  'l',
                                    '-',  'k',
                                    'n',  'o',
                                    'w',  'n', // uri-path
                                    0x03, 'e',
                                    's',  't', // uri-path
                                    0x02, 'r',
                                    'v',                                              // uri-path
                                    0x11, utils::to_underlying(ContentFormat::kCBOR), // content-format
                                    0x51, utils::to_underlying(ContentFormat::kCoseSign1)};

    EXPECT_EQ(buffer, expectedBuffer);

    message = Message::Deserialize(error, buffer);
    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetOptionNum(), 3);

    ContentFormat contentFormat;
    EXPECT_EQ(message->GetContentFormat(contentFormat), ErrorCode::kNone);
    EXPECT_EQ(contentFormat, ContentFormat::kCBOR);

    std::string uriPath;
    EXPECT_EQ(message->GetUriPath(uriPath), ErrorCode::kNone);

    // ".well-known/est/rv/" is normalized to "/.well-known/est/rv"
    EXPECT_EQ(uriPath, "/.well-known/est/rv");

    ContentFormat accept;
    EXPECT_EQ(message->GetAccept(accept), ErrorCode::kNone);
    EXPECT_EQ(accept, ContentFormat::kCoseSign1);
}